

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O2

tc_toktyp_t
CTcTokenizer::next_on_line
          (CTcTokString *srcbuf,utf8_ptr *p,CTcToken *tok,tok_embed_ctx *ec,int expanding)

{
  tok_embed_ctx oldec;
  undefined1 auStack_d8 [176];
  
  memcpy(auStack_d8,ec,0xb0);
  next_on_line(p,tok,ec,expanding);
  if (srcbuf->buf_ + srcbuf->buf_len_ <= tok->text_) {
    tok->typ_ = TOKT_EOF;
    tok->text_ = srcbuf->buf_ + srcbuf->buf_len_;
    tok->text_len_ = 0;
    memcpy(ec,auStack_d8,0xb0);
  }
  return tok->typ_;
}

Assistant:

tc_toktyp_t CTcTokenizer::next_on_line(const CTcTokString *srcbuf,
                                       utf8_ptr *p, CTcToken *tok,
                                       tok_embed_ctx *ec, int expanding)
{
    /* 
     *   save the embedding context, in case the next token isn't part of the
     *   narrowed section of the buffer we're scanning 
     */
    tok_embed_ctx oldec = *ec;

    /* get the next token */
    next_on_line(p, tok, ec, expanding);
    
    /* if the token is past the end of the line, return EOF */
    if (tok->get_text() >= srcbuf->get_text_end())
    {
        /* set the token to indicate end of line */
        tok->settyp(TOKT_EOF);

        /* set the token to point to the end of the buffer */
        tok->set_text(srcbuf->get_text_end(), 0);

        /* restore the embedding context */
        *ec = oldec;
    }
    
    /* return the token type */
    return tok->gettyp();
}